

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  undefined8 linkLineComputer;
  bool bVar4;
  cmStateDirectory *stateDir;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  undefined1 local_e8 [32];
  PositionType local_c8;
  char *local_c0;
  undefined1 local_b8 [16];
  cmMakefile *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar4 = cmGeneratorTarget::IsFrameworkOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar4) {
    WriteFrameworkRules(this,relink);
    return;
  }
  if (!relink) {
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              ((string *)local_e8,&this->super_cmMakefileTargetGenerator);
    bVar4 = requireDeviceLinking(pcVar2,(cmLocalGenerator *)pcVar3,(string *)local_e8);
    pcVar1 = local_e8 + 0x10;
    if ((pointer)local_e8._0_8_ != pcVar1) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (bVar4) {
      local_e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY","");
      WriteDeviceLibraryRules(this,(string *)local_e8,false);
      if ((pointer)local_e8._0_8_ != pcVar1) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
    }
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_e8,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_90,pcVar2,(string *)local_e8);
  pcVar1 = local_e8 + 0x10;
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  local_e8._0_8_ = (pointer)0x6;
  local_e8._8_8_ = "CMAKE_";
  local_e8._16_8_ = local_90._M_string_length;
  local_e8._24_8_ = local_90._M_dataplus._M_p;
  local_c8 = 0x16;
  local_c0 = "_CREATE_SHARED_LIBRARY";
  views._M_len = 3;
  views._M_array = (iterator)local_e8;
  cmCatViews_abi_cxx11_(&local_50,views);
  local_b8._8_8_ = &local_a0;
  local_a8 = (cmMakefile *)0x0;
  local_a0._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)(local_b8 + 8),&local_90);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_SHARED_LINKER_FLAGS","")
  ;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_70,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar3,(string *)(local_b8 + 8),(string *)local_e8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  stateDir = (cmStateDirectory *)
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar3 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    stateDir = (cmStateDirectory *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_70,(cmLocalGenerator *)pcVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e8,(cmStateSnapshot *)&local_70);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_b8,(cmOutputConverter *)this,stateDir);
  linkLineComputer = local_b8._0_8_;
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_e8,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar3,(string *)(local_b8 + 8),pcVar2,
             (cmLinkLineComputer *)linkLineComputer,(string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar1) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  bVar4 = cmLocalGenerator::AppendLWYUFlags
                    ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     (string *)(local_b8 + 8),
                     (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&local_90);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.UseLWYU = bVar4;
  WriteLibraryRules(this,&local_50,(string *)(local_b8 + 8),relink);
  if ((cmLinkLineComputer *)local_b8._0_8_ != (cmLinkLineComputer *)0x0) {
    (*(*(_func_int ***)local_b8._0_8_)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._8_8_ != &local_a0) {
    operator_delete((void *)local_b8._8_8_,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if (this->GeneratorTarget->IsFrameworkOnApple()) {
    this->WriteFrameworkRules(relink);
    return;
  }

  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_LIBRARY");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->UseLWYU = this->LocalGenerator->AppendLWYUFlags(
    extraFlags, this->GeneratorTarget, linkLanguage);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}